

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O0

bool Assimp::IFC::IntersectSegmentPlane
               (IfcVector3 *p,IfcVector3 *n,IfcVector3 *e0,IfcVector3 *e1,
               bool assumeStartOnWhiteSide,IfcVector3 *out)

{
  int __x;
  double dVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  aiVector3t<double> local_b8;
  aiVector3t<double> local_a0;
  double local_88;
  IfcFloat t;
  IfcFloat dotTwo;
  IfcFloat dotOne;
  IfcVector3 seg;
  IfcVector3 pdelta;
  IfcVector3 *out_local;
  bool assumeStartOnWhiteSide_local;
  IfcVector3 *e1_local;
  IfcVector3 *e0_local;
  IfcVector3 *n_local;
  IfcVector3 *p_local;
  
  ::operator-((aiVector3t<double> *)&seg.z,e0,p);
  ::operator-((aiVector3t<double> *)&dotOne,e1,e0);
  dotTwo = ::operator*(n,(aiVector3t<double> *)&dotOne);
  dVar1 = ::operator*(n,(aiVector3t<double> *)&seg.z);
  t = -dVar1;
  __x = (int)n;
  std::abs(__x);
  if (1e-06 <= extraout_XMM0_Qa) {
    std::abs(__x);
    if (1e-06 <= extraout_XMM0_Qa_00) {
      std::abs(__x);
      if (1e-06 <= extraout_XMM0_Qa_01) {
        local_88 = t / dotTwo;
        if ((1.0 < local_88) || (local_88 < 0.0)) {
          p_local._7_1_ = false;
        }
        else {
          ::operator*(&local_b8,local_88,(aiVector3t<double> *)&dotOne);
          ::operator+(&local_a0,e0,&local_b8);
          out->x = local_a0.x;
          out->y = local_a0.y;
          out->z = local_a0.z;
          p_local._7_1_ = true;
        }
      }
      else {
        p_local._7_1_ = false;
      }
    }
    else if (((assumeStartOnWhiteSide) && (dotTwo + t < 1e-06)) ||
            ((!assumeStartOnWhiteSide && (-1e-06 < dotTwo + t)))) {
      out->x = e0->x;
      out->y = e0->y;
      out->z = e0->z;
      p_local._7_1_ = true;
    }
    else {
      p_local._7_1_ = false;
    }
  }
  else {
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

bool IntersectSegmentPlane(const IfcVector3& p,const IfcVector3& n, const IfcVector3& e0,
        const IfcVector3& e1, bool assumeStartOnWhiteSide, IfcVector3& out)
{
    const IfcVector3 pdelta = e0 - p, seg = e1 - e0;
    const IfcFloat dotOne = n*seg, dotTwo = -(n*pdelta);

    // if segment ends on plane, do not report a hit. We stay on that side until a following segment starting at this
    // point leaves the plane through the other side
    if( std::abs(dotOne + dotTwo) < 1e-6 )
        return false;

    // if segment starts on the plane, report a hit only if the end lies on the *other* side
    if( std::abs(dotTwo) < 1e-6 )
    {
        if( (assumeStartOnWhiteSide && dotOne + dotTwo < 1e-6) || (!assumeStartOnWhiteSide && dotOne + dotTwo > -1e-6) )
        {
            out = e0;
            return true;
        }
        else
        {
            return false;
        }
    }

    // ignore if segment is parallel to plane and far away from it on either side
    // Warning: if there's a few thousand of such segments which slowly accumulate beyond the epsilon, no hit would be registered
    if( std::abs(dotOne) < 1e-6 )
        return false;

    // t must be in [0..1] if the intersection point is within the given segment
    const IfcFloat t = dotTwo / dotOne;
    if( t > 1.0 || t < 0.0 )
        return false;

    out = e0 + t*seg;
    return true;
}